

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O1

int __thiscall Jupiter::Timer::think(Timer *this)

{
  uint uVar1;
  long lVar2;
  
  lVar2 = std::chrono::_V2::steady_clock::now();
  uVar1 = 0;
  if ((this->m_next_call).__d.__r <= lVar2) {
    uVar1 = 0;
    if (this->m_iterations != 0) {
      uVar1 = this->m_iterations - 1;
      this->m_iterations = uVar1;
      uVar1 = (uint)(uVar1 == 0);
    }
    (*this->m_function)(this->m_iterations,this->m_parameters);
    lVar2 = std::chrono::_V2::steady_clock::now();
    (this->m_next_call).__d.__r = (this->m_delay).__r * 1000000 + lVar2;
  }
  return uVar1;
}

Assistant:

int Jupiter::Timer::think()
{
	if (m_next_call <= std::chrono::steady_clock::now())
	{
		int killMe = 0;

		if (m_iterations != 0 && --m_iterations == 0)
			killMe = 1;

		m_function(m_iterations, m_parameters);
		m_next_call = m_delay + std::chrono::steady_clock::now();

		return killMe;
	}

	return 0;
}